

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

void sqlcheck::CheckRecursiveDependency
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  size_type *psVar3;
  string title;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  regex pattern;
  string table_name;
  
  GetTableName(&table_name,sql_statement);
  if (table_name._M_string_length != 0) {
    std::operator+(&local_90,"(references\\s+",&table_name);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
    paVar1 = &title.field_2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar3) {
      title.field_2._M_allocated_capacity = *psVar3;
      title.field_2._8_8_ = plVar2[3];
      title._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      title.field_2._M_allocated_capacity = *psVar3;
      title._M_dataplus._M_p = (pointer)*plVar2;
    }
    title._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&pattern,&title,0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)title._M_dataplus._M_p != paVar1) {
      operator_delete(title._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    title._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&title,"Recursive Dependency","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,title._M_dataplus._M_p,
               title._M_dataplus._M_p + title._M_string_length);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,anon_var_dwarf_7ad38,anon_var_dwarf_7ad38 + 0x2ed);
    CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_HIGH,
                 PATTERN_TYPE_LOGICAL_DATABASE_DESIGN,&local_d0,&local_b0,true,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)title._M_dataplus._M_p != &title.field_2) {
      operator_delete(title._M_dataplus._M_p);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)table_name._M_dataplus._M_p != &table_name.field_2) {
    operator_delete(table_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CheckRecursiveDependency(Configuration& state,
                              const std::string& sql_statement,
                              bool& print_statement){

  std::string table_name = GetTableName(sql_statement);
  if(table_name.empty()){
    return;
  }

  std::regex pattern("(references\\s+" + table_name+ ")");
  std::string title = "Recursive Dependency";
  PatternType pattern_type = PatternType::PATTERN_TYPE_LOGICAL_DATABASE_DESIGN;

  auto message =
      "● Avoid recursive relationships:  "
      "It’s common for data to have recursive relationships. Data may be organized in a "
      "treelike or hierarchical way. However, creating a foreign key constraint to enforce "
      "the relationship between two columns in the same table lends to awkward querying. "
      "Each level of the tree corresponds to another join. You will need to issue recursive "
      "queries to get all descendants or all ancestors of a node. "
      "A solution is to construct an additional closure table. It involves storing all paths "
      "through the tree, not just those with a direct parent-child relationship. "
      "You might want to compare different hierarchical data designs -- closure table, "
      "path enumeration, nested sets -- and pick one based on your application's needs.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_HIGH,
               pattern_type,
               title,
               message,
               true);

}